

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshader.cpp
# Opt level: O0

QByteArray * __thiscall QShader::serialized(QShader *this,SerializedFormatVersion version)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type_conflict sVar5;
  pair<int,_int> *ppVar6;
  QList<QShader::SeparateToCombinedImageSamplerMapping> *this_00;
  qsizetype qVar7;
  const_iterator o;
  SeparateToCombinedImageSamplerMapping *pSVar8;
  QShaderKey *ds_00;
  NativeShaderInfo *pNVar9;
  int *piVar10;
  SerializedFormatVersion in_EDX;
  QShaderKey *in_RSI;
  QShaderCode *in_RDI;
  long in_FS_OFFSET;
  QShaderKey *k_3;
  SeparateToCombinedImageSamplerMappingList *list;
  QShaderKey *k_2;
  NativeResourceBindingMap *map;
  QShaderKey *k_1;
  QShaderCode *shader;
  QShaderKey *k;
  int qsbVersion;
  QShaderPrivate *dd;
  const_iterator mapItEnd_1;
  const_iterator mapIt_1;
  const_iterator itEnd_3;
  const_iterator it_3;
  const_iterator listItEnd;
  const_iterator listIt;
  const_iterator itEnd_2;
  const_iterator it_2;
  const_iterator mapItEnd;
  const_iterator mapIt;
  const_iterator itEnd_1;
  const_iterator it_1;
  const_iterator itEnd;
  const_iterator it;
  QBuffer buf;
  QDataStream ds;
  QShaderCode *in_stack_fffffffffffffe28;
  QShaderPrivate *in_stack_fffffffffffffe30;
  QShaderPrivate *local_1c8;
  int compressionLevel;
  QShaderCode *key;
  QDataStream *in_stack_fffffffffffffe58;
  const_iterator local_118;
  const_iterator local_110;
  const_iterator local_108;
  const_iterator local_100;
  const_iterator local_f8;
  const_iterator local_f0;
  const_iterator local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  undefined1 local_b0 [96];
  const_iterator local_50;
  const_iterator local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  if ((serialized(QShader::SerializedFormatVersion)::sd == '\0') &&
     (iVar3 = __cxa_guard_acquire(&serialized(QShader::SerializedFormatVersion)::sd), iVar3 != 0)) {
    QShaderPrivate::QShaderPrivate(in_stack_fffffffffffffe30);
    __cxa_atexit(QShaderPrivate::~QShaderPrivate,&serialized::sd,&__dso_handle);
    __cxa_guard_release(&serialized(QShader::SerializedFormatVersion)::sd);
  }
  lVar1._0_4_ = in_RSI->m_source;
  lVar1._4_4_ = (in_RSI->m_sourceVersion).m_version;
  if (lVar1 == 0) {
    local_1c8 = &serialized::sd;
  }
  else {
    local_1c8 = *(QShaderPrivate **)in_RSI;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QBuffer::QBuffer((QBuffer *)&local_38,(QObject *)0x0);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_28,(QIODevice *)&local_38);
  QDataStream::setVersion((QDataStream *)&local_28,0x11);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe30,
             (OpenModeFlag)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  uVar4 = QBuffer::open((QFlags_conflict *)&local_38);
  if ((uVar4 & 1) == 0) {
    QByteArray::QByteArray((QByteArray *)0x6b72ae);
  }
  else {
    iVar3 = QShaderPrivate::qtQsbVersion(in_EDX);
    QDataStream::operator<<((QDataStream *)&local_28,iVar3);
    QDataStream::operator<<((QDataStream *)&local_28,local_1c8->stage);
    QShaderDescription::serialize
              ((QShaderDescription *)in_stack_fffffffffffffe30,
               (QDataStream *)in_stack_fffffffffffffe28,0);
    sVar5 = QMap<QShaderKey,_QShaderCode>::size
                      ((QMap<QShaderKey,_QShaderCode> *)in_stack_fffffffffffffe30);
    QDataStream::operator<<((QDataStream *)&local_28,(int)sVar5);
    local_48._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_48._M_node =
         (_Base_ptr)
         QMap<QShaderKey,_QShaderCode>::cbegin
                   ((QMap<QShaderKey,_QShaderCode> *)in_stack_fffffffffffffe28);
    local_50._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_50._M_node =
         (_Base_ptr)
         QMap<QShaderKey,_QShaderCode>::cend
                   ((QMap<QShaderKey,_QShaderCode> *)in_stack_fffffffffffffe28);
    while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30,
                                (const_iterator *)in_stack_fffffffffffffe28), bVar2) {
      in_stack_fffffffffffffe30 =
           (QShaderPrivate *)
           QMap<QShaderKey,_QShaderCode>::const_iterator::key((const_iterator *)0x6b73a9);
      writeShaderKey(in_stack_fffffffffffffe58,in_RSI);
      in_stack_fffffffffffffe28 = (QShaderCode *)&local_1c8->shaders;
      memset(local_b0,0,0x30);
      QShaderCode::QShaderCode((QShaderCode *)in_stack_fffffffffffffe30);
      QMap<QShaderKey,_QShaderCode>::value
                ((QMap<QShaderKey,_QShaderCode> *)in_RSI,(QShaderKey *)key,in_RDI);
      QShaderCode::~QShaderCode((QShaderCode *)in_stack_fffffffffffffe30);
      QShaderCode::shader(in_stack_fffffffffffffe28);
      ::operator<<((QDataStream *)&local_28,(QByteArray *)local_c8);
      QByteArray::~QByteArray((QByteArray *)0x6b7473);
      QShaderCode::entryPoint(in_stack_fffffffffffffe28);
      ::operator<<((QDataStream *)&local_28,(QByteArray *)local_e0);
      QByteArray::~QByteArray((QByteArray *)0x6b74a7);
      QShaderCode::~QShaderCode((QShaderCode *)in_stack_fffffffffffffe30);
      QMap<QShaderKey,_QShaderCode>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffe30);
    }
    sVar5 = QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_>::size
                      ((QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_> *)
                       in_stack_fffffffffffffe30);
    QDataStream::operator<<((QDataStream *)&local_28,(int)sVar5);
    local_e8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_e8._M_node =
         (_Base_ptr)
         QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_>::cbegin
                   ((QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_> *)in_stack_fffffffffffffe28)
    ;
    local_f0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_f0._M_node =
         (_Base_ptr)
         QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_>::cend
                   ((QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_> *)in_stack_fffffffffffffe28)
    ;
    while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30,
                                (const_iterator *)in_stack_fffffffffffffe28), bVar2) {
      QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_>::const_iterator::key
                ((const_iterator *)0x6b7567);
      writeShaderKey(in_stack_fffffffffffffe58,in_RSI);
      QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_>::const_iterator::value
                ((const_iterator *)0x6b759a);
      sVar5 = QMap<int,_std::pair<int,_int>_>::size
                        ((QMap<int,_std::pair<int,_int>_> *)in_stack_fffffffffffffe30);
      QDataStream::operator<<((QDataStream *)&local_28,(int)sVar5);
      local_f8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_f8._M_node =
           (_Base_ptr)
           QMap<int,_std::pair<int,_int>_>::cbegin
                     ((QMap<int,_std::pair<int,_int>_> *)in_stack_fffffffffffffe28);
      local_100._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_100._M_node =
           (_Base_ptr)
           QMap<int,_std::pair<int,_int>_>::cend
                     ((QMap<int,_std::pair<int,_int>_> *)in_stack_fffffffffffffe28);
      while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30,
                                  (const_iterator *)in_stack_fffffffffffffe28), bVar2) {
        piVar10 = QMap<int,_std::pair<int,_int>_>::const_iterator::key((const_iterator *)0x6b7622);
        QDataStream::operator<<((QDataStream *)&local_28,*piVar10);
        ppVar6 = QMap<int,_std::pair<int,_int>_>::const_iterator::value((const_iterator *)0x6b763e);
        QDataStream::operator<<((QDataStream *)&local_28,ppVar6->first);
        ppVar6 = QMap<int,_std::pair<int,_int>_>::const_iterator::value((const_iterator *)0x6b765a);
        QDataStream::operator<<((QDataStream *)&local_28,ppVar6->second);
        QMap<int,_std::pair<int,_int>_>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffe30);
      }
      QMap<QShaderKey,_QMap<int,_std::pair<int,_int>_>_>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffe30);
    }
    sVar5 = QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>::size
                      ((QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_> *)
                       in_stack_fffffffffffffe30);
    QDataStream::operator<<((QDataStream *)&local_28,(int)sVar5);
    local_108._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_108._M_node =
         (_Base_ptr)
         QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>::cbegin
                   ((QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_> *)
                    in_stack_fffffffffffffe28);
    local_110._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_110._M_node =
         (_Base_ptr)
         QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>::cend
                   ((QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_> *)
                    in_stack_fffffffffffffe28);
    while( true ) {
      bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30,
                           (const_iterator *)in_stack_fffffffffffffe28);
      compressionLevel = (int)((ulong)in_RDI >> 0x20);
      if (!bVar2) break;
      QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>::const_iterator::key
                ((const_iterator *)0x6b772e);
      writeShaderKey(in_stack_fffffffffffffe58,in_RSI);
      this_00 = QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>::
                const_iterator::value((const_iterator *)0x6b7761);
      qVar7 = QList<QShader::SeparateToCombinedImageSamplerMapping>::size(this_00);
      QDataStream::operator<<((QDataStream *)&local_28,(int)qVar7);
      local_118.i = (SeparateToCombinedImageSamplerMapping *)&DAT_aaaaaaaaaaaaaaaa;
      local_118 = QList<QShader::SeparateToCombinedImageSamplerMapping>::cbegin
                            ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                             in_stack_fffffffffffffe30);
      o = QList<QShader::SeparateToCombinedImageSamplerMapping>::cend
                    ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                     in_stack_fffffffffffffe30);
      while (bVar2 = QList<QShader::SeparateToCombinedImageSamplerMapping>::const_iterator::
                     operator!=(&local_118,o), bVar2) {
        pSVar8 = QList<QShader::SeparateToCombinedImageSamplerMapping>::const_iterator::operator->
                           (&local_118);
        ::operator<<((QDataStream *)&local_28,(QByteArray *)pSVar8);
        pSVar8 = QList<QShader::SeparateToCombinedImageSamplerMapping>::const_iterator::operator->
                           (&local_118);
        QDataStream::operator<<((QDataStream *)&local_28,pSVar8->textureBinding);
        pSVar8 = QList<QShader::SeparateToCombinedImageSamplerMapping>::const_iterator::operator->
                           (&local_118);
        QDataStream::operator<<((QDataStream *)&local_28,pSVar8->samplerBinding);
        QList<QShader::SeparateToCombinedImageSamplerMapping>::const_iterator::operator++
                  (&local_118);
      }
      QMap<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>::const_iterator::
      operator++((const_iterator *)in_stack_fffffffffffffe30);
    }
    if (6 < iVar3) {
      sVar5 = QMap<QShaderKey,_QShader::NativeShaderInfo>::size
                        ((QMap<QShaderKey,_QShader::NativeShaderInfo> *)in_stack_fffffffffffffe30);
      QDataStream::operator<<((QDataStream *)&local_28,(int)sVar5);
      QMap<QShaderKey,_QShader::NativeShaderInfo>::cbegin
                ((QMap<QShaderKey,_QShader::NativeShaderInfo> *)in_stack_fffffffffffffe28);
      QMap<QShaderKey,_QShader::NativeShaderInfo>::cend
                ((QMap<QShaderKey,_QShader::NativeShaderInfo> *)in_stack_fffffffffffffe28);
      while( true ) {
        bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30,
                             (const_iterator *)in_stack_fffffffffffffe28);
        compressionLevel = (int)((ulong)in_RDI >> 0x20);
        if (!bVar2) break;
        ds_00 = QMap<QShaderKey,_QShader::NativeShaderInfo>::const_iterator::key
                          ((const_iterator *)0x6b7915);
        writeShaderKey((QDataStream *)ds_00,in_RSI);
        pNVar9 = QMap<QShaderKey,_QShader::NativeShaderInfo>::const_iterator::operator->
                           ((const_iterator *)0x6b7939);
        QDataStream::operator<<((QDataStream *)&local_28,pNVar9->flags);
        QMap<QShaderKey,_QShader::NativeShaderInfo>::const_iterator::operator->
                  ((const_iterator *)0x6b7955);
        sVar5 = QMap<int,_int>::size((QMap<int,_int> *)in_stack_fffffffffffffe30);
        QDataStream::operator<<((QDataStream *)&local_28,(int)sVar5);
        QMap<QShaderKey,_QShader::NativeShaderInfo>::const_iterator::operator->
                  ((const_iterator *)0x6b798c);
        QMap<int,_int>::cbegin((QMap<int,_int> *)in_stack_fffffffffffffe28);
        QMap<QShaderKey,_QShader::NativeShaderInfo>::const_iterator::operator->
                  ((const_iterator *)0x6b79bc);
        QMap<int,_int>::cend((QMap<int,_int> *)in_stack_fffffffffffffe28);
        while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30,
                                    (const_iterator *)in_stack_fffffffffffffe28), bVar2) {
          piVar10 = QMap<int,_int>::const_iterator::key((const_iterator *)0x6b79f8);
          QDataStream::operator<<((QDataStream *)&local_28,*piVar10);
          piVar10 = QMap<int,_int>::const_iterator::value((const_iterator *)0x6b7a14);
          QDataStream::operator<<((QDataStream *)&local_28,*piVar10);
          QMap<int,_int>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe30);
        }
        QMap<QShaderKey,_QShader::NativeShaderInfo>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffe30);
      }
    }
    QBuffer::buffer();
    qCompress(&key->m_shader,compressionLevel);
  }
  QDataStream::~QDataStream((QDataStream *)&local_28);
  QBuffer::~QBuffer((QBuffer *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &key->m_shader;
}

Assistant:

QByteArray QShader::serialized(SerializedFormatVersion version) const
{
    static QShaderPrivate sd;
    QShaderPrivate *dd = d ? d : &sd;

    QBuffer buf;
    QDataStream ds(&buf);
    ds.setVersion(QDataStream::Qt_5_10);
    if (!buf.open(QIODevice::WriteOnly))
        return QByteArray();

    const int qsbVersion = QShaderPrivate::qtQsbVersion(version);
    ds << qsbVersion;

    ds << int(dd->stage);
    dd->desc.serialize(&ds, qsbVersion);
    ds << int(dd->shaders.size());
    for (auto it = dd->shaders.cbegin(), itEnd = dd->shaders.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const QShaderCode &shader(dd->shaders.value(k));
        ds << shader.shader();
        ds << shader.entryPoint();
    }
    ds << int(dd->bindings.size());
    for (auto it = dd->bindings.cbegin(), itEnd = dd->bindings.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const NativeResourceBindingMap &map(it.value());
        ds << int(map.size());
        for (auto mapIt = map.cbegin(), mapItEnd = map.cend(); mapIt != mapItEnd; ++mapIt) {
            ds << mapIt.key();
            ds << mapIt.value().first;
            ds << mapIt.value().second;
        }
    }
    ds << int(dd->combinedImageMap.size());
    for (auto it = dd->combinedImageMap.cbegin(), itEnd = dd->combinedImageMap.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const SeparateToCombinedImageSamplerMappingList &list(it.value());
        ds << int(list.size());
        for (auto listIt = list.cbegin(), listItEnd = list.cend(); listIt != listItEnd; ++listIt) {
            ds << listIt->combinedSamplerName;
            ds << listIt->textureBinding;
            ds << listIt->samplerBinding;
        }
    }
    if (qsbVersion > QShaderPrivate::QSB_VERSION_WITHOUT_NATIVE_SHADER_INFO) {
        ds << int(dd->nativeShaderInfoMap.size());
        for (auto it = dd->nativeShaderInfoMap.cbegin(), itEnd = dd->nativeShaderInfoMap.cend(); it != itEnd; ++it) {
            const QShaderKey &k(it.key());
            writeShaderKey(&ds, k);
            ds << it->flags;
            ds << int(it->extraBufferBindings.size());
            for (auto mapIt = it->extraBufferBindings.cbegin(), mapItEnd = it->extraBufferBindings.cend();
                 mapIt != mapItEnd; ++mapIt)
            {
                ds << mapIt.key();
                ds << mapIt.value();
            }
        }
    }

    return qCompress(buf.buffer());
}